

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECDecoding.cpp
# Opt level: O2

SeqEntry * __thiscall
ECdecoding::decode(SeqEntry *__return_storage_ptr__,ECdecoding *this,int codewordLen,
                  unordered_map<string,_vector<string>_> *motif,json *config)

{
  int sync;
  reference pvVar1;
  ostream *poVar2;
  reference puVar3;
  unsigned_long threshold;
  char2double *nextProbs_00;
  array<double,_2UL> *fanoMetrics;
  SeqEntry *sequence_00;
  iterator iVar4;
  array<char,_4UL> bases;
  pair<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  local_bc0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_ba0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b88;
  string local_b70;
  string s;
  char2double nextProbs;
  BitOutStream local_af8;
  BitOutStream bitOut;
  ProbabilityEval currSeq;
  Deflate local_948;
  Deflate ac;
  SeqEntry baseLine;
  SeqEntry sequence;
  pair<int,_SeqEntry> local_298;
  
  builtin_strncpy(bases._M_elems,"ATCG",4);
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)config,"decode");
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar1,"metric");
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar1,"fano");
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar1,"rate");
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar1,"low");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<int,_0>(pvVar1);
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)config,"decode");
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar1,"metric");
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar1,"fano");
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar1,"rate");
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar1,"high");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<int,_0>(pvVar1);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  ProbabilityEval::ProbabilityEval(&currSeq,&s,motif,0,true,codewordLen,this->probMap);
  ProbabilityEval::nextProbsSingleLetter(&nextProbs,&currSeq);
  local_b88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_ba0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b88);
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)config,"general");
  pvVar1 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar1,"sync");
  sync = nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         ::get_impl<int,_0>(pvVar1);
  BitOutStream::BitOutStream(&bitOut,(DecodedData *)&local_ba0,sync);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_ba0);
  BitOutStream::BitOutStream(&local_af8,&bitOut);
  Deflate::Deflate(&ac,0x10,&local_af8);
  BitOutStream::~BitOutStream(&local_af8);
  Deflate::Deflate(&local_948,&ac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b70,"",(allocator<char> *)&local_298);
  SeqEntry::SeqEntry(&sequence,0.0,&currSeq.seq,0,&local_948,&this->frequencyMap,&local_b70);
  std::__cxx11::string::~string((string *)&local_b70);
  Deflate::~Deflate(&local_948);
  SeqEntry::SeqEntry(&baseLine,&sequence);
  local_298.first = 0;
  SeqEntry::SeqEntry(&local_298.second,&baseLine);
  robin_hood::detail::
  Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::emplace<std::__cxx11::string&,std::pair<int,SeqEntry>>
            (&local_bc0,
             (Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              *)&this->crcCheckpoints,&baseLine.seq,&local_298);
  SeqEntry::~SeqEntry(&local_298.second);
  sequence_00 = &sequence;
  nextProbs_00 = &nextProbs;
  metricProbs(this,sequence_00,fanoMetrics,nextProbs_00,&bases);
  mainLoop(this,(array<double,_2UL> *)sequence_00,&bases,(int)nextProbs_00);
  poVar2 = std::operator<<((ostream *)&std::cout,"[+] ");
  poVar2 = std::operator<<(poVar2,"Finished first run, checking CRC...");
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar4 = absl::container_internal::
          btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
          ::begin((btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                   *)&this->queue);
  local_bc0.first.mKeyVals = (NodePtr)iVar4.node_;
  local_bc0.first.mInfo._0_4_ = iVar4.position_;
  puVar3 = absl::container_internal::
           btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
           ::operator*((btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
                        *)&local_bc0);
  SeqEntry::SeqEntry(__return_storage_ptr__,
                     (puVar3->_M_t).super___uniq_ptr_impl<SeqEntry,_std::default_delete<SeqEntry>_>.
                     _M_t.super__Tuple_impl<0UL,_SeqEntry_*,_std::default_delete<SeqEntry>_>.
                     super__Head_base<0UL,_SeqEntry_*,_false>._M_head_impl);
  iVar4.position_ = (int)local_bc0.first.mInfo;
  iVar4.node_ = (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                 *)local_bc0.first.mKeyVals;
  iVar4._12_4_ = 0;
  absl::container_internal::
  btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  ::erase((btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
           *)&this->queue,iVar4);
  while (this->endFailed == true) {
    this->endFailed = false;
    Deflate::finish(&__return_storage_ptr__->ac);
    poVar2 = std::operator<<((ostream *)&std::cout,"[+] ");
    poVar2 = std::operator<<(poVar2,"CRC SUCCESSFUL in iteration: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    std::operator<<(poVar2," metric ");
    poVar2 = std::ostream::_M_insert<double>(__return_storage_ptr__->metric);
    std::endl<char,std::char_traits<char>>(poVar2);
    pvVar1 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)config,"decode");
    pvVar1 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar1,"threshold");
    pvVar1 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar1,"finish");
    threshold = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get_impl<unsigned_long,_0>(pvVar1);
    checkCandidate((SeqEntry *)&local_298,this,__return_storage_ptr__,threshold);
    SeqEntry::operator=(__return_storage_ptr__,(SeqEntry *)&local_298);
    SeqEntry::~SeqEntry((SeqEntry *)&local_298);
  }
  SeqEntry::~SeqEntry(&baseLine);
  SeqEntry::~SeqEntry(&sequence);
  Deflate::~Deflate(&ac);
  BitOutStream::~BitOutStream(&bitOut);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b88);
  robin_hood::detail::
  Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::destroy
            (&nextProbs);
  ProbabilityEval::~ProbabilityEval(&currSeq);
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

SeqEntry ECdecoding::decode(int codewordLen, robin_hood::unordered_map<string, vector<string>> &motif, nlohmann::json &config) {
    array<char, 4> bases{'A', 'T', 'C', 'G'};
    int itCount = 0;
    array<int, 2> e_rate = {config["decode"]["metric"]["fano"]["rate"]["low"],config["decode"]["metric"]["fano"]["rate"]["high"]};
    array<double, 2> fanoMetrics = getFanos(errorProb, e_rate);
    string s;
    ProbabilityEval currSeq = ProbabilityEval(s, motif, 0, true, codewordLen, &probMap);
    char2double nextProbs = currSeq.nextProbsSingleLetter();
    DecodedData dec = DecodedData();
    BitOutStream bitOut = BitOutStream(dec, config["general"]["sync"]);
    Deflate ac = Deflate(16, bitOut);
    SeqEntry sequence = SeqEntry(0.0, currSeq.seq, 0, ac, frequencyMap);
    //put in the empty sequence in the crcCheckpoint map as a last-resort
    SeqEntry baseLine = sequence;
    crcCheckpoints.emplace(baseLine.seq, std::pair(0, baseLine));
    metricProbs(sequence, fanoMetrics, nextProbs, bases);
    try {
        mainLoop(fanoMetrics, bases, itCount);
    } catch (const logic_error &e) {
        WARN(e.what());
        SeqEntry res = **queue.begin();
        res.metric = 1000;
        return res;
    }
    SUCCESS("Finished first run, checking CRC...");
    auto itr = queue.begin();
    SeqEntry res = **itr;
    queue.erase(itr);
    while (endFailed) {
        try {
            endFailed = false;
            res.ac.finish();
            SUCCESS("CRC SUCCESSFUL in iteration: " << itCount << " metric " << res.metric);
            res = checkCandidate(res, config["decode"]["threshold"]["finish"]);
        } catch (const logic_error &e) {
            INFO("CRC FAILED in iteration: " << itCount);
            endFailed = true;
            try {
                mainLoop(fanoMetrics, bases, itCount);
            } catch (const logic_error &e) {
                WARN(e.what());
                res.metric = 1000;
                return res;
            }
            itr = queue.begin();
            res = **itr;
            queue.erase(itr);
            itCount++;
        }
    }
    return res;
}